

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingImpl.hpp
# Opt level: O2

void __thiscall
Diligent::ResourceMappingImpl::ResMappingHashKey::ResMappingHashKey
          (ResMappingHashKey *this,Char *Str,bool bMakeCopy,Uint32 ArrInd)

{
  size_t sVar1;
  Uint32 local_24;
  ulong local_20;
  
  local_24 = ArrInd;
  HashMapStringKey::HashMapStringKey(&this->super_HashMapStringKey,Str,bMakeCopy);
  this->ArrayIndex = ArrInd;
  local_20 = (this->super_HashMapStringKey).Ownership_Hash & 0x7fffffffffffffff;
  sVar1 = ComputeHash<unsigned_long,unsigned_int>(&local_20,&local_24);
  (this->super_HashMapStringKey).Ownership_Hash =
       (this->super_HashMapStringKey).Ownership_Hash & 0x8000000000000000 |
       sVar1 & 0x7fffffffffffffff;
  return;
}

Assistant:

ResMappingHashKey(const Char* Str, bool bMakeCopy, Uint32 ArrInd) noexcept :
            HashMapStringKey{Str, bMakeCopy},
            ArrayIndex{ArrInd}
        {
            Ownership_Hash = (ComputeHash(GetHash(), ArrInd) & HashMask) | (Ownership_Hash & StrOwnershipMask);
        }